

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.h
# Opt level: O3

void __thiscall
wasm::ABI::getStackSpace(ABI *this,Index local,Function *func,Index size,Module *wasm)

{
  pointer *this_00;
  Builder *ast;
  pointer puVar1;
  Expression **ppEVar2;
  size_t sVar3;
  char *pcVar4;
  undefined8 uVar5;
  uintptr_t uVar6;
  pointer puVar7;
  pointer puVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Index IVar11;
  Global *pGVar12;
  Module *pMVar13;
  Expression *pEVar14;
  Const *pCVar15;
  Binary *pBVar16;
  LocalSet *pLVar17;
  GlobalSet *pGVar18;
  Expression *pEVar19;
  Block *this_01;
  undefined1 *puVar20;
  Module *this_02;
  undefined4 in_register_0000000c;
  Expression **ppEVar21;
  MixedArena *pMVar22;
  undefined4 in_register_00000034;
  Builder *this_03;
  Index IVar23;
  ExpressionList *this_04;
  uint x;
  undefined1 auVar24 [8];
  bool bVar25;
  Signature SVar26;
  optional<wasm::Type> type_;
  optional<wasm::Type> type__00;
  optional<wasm::Type> type;
  undefined1 local_238 [8];
  FindAllPointers<wasm::Return> finder;
  Builder local_38;
  Builder builder;
  
  this_03 = (Builder *)CONCAT44(in_register_00000034,local);
  pMVar13 = (Module *)CONCAT44(in_register_0000000c,size);
  IVar23 = (Index)this;
  pGVar12 = getStackPointerGlobal(pMVar13);
  if (pGVar12 == (Global *)0x0) {
    Fatal::Fatal((Fatal *)local_238);
    Fatal::operator<<((Fatal *)local_238,
                      (char (*) [48])"getStackSpace: failed to find the stack pointer");
    Fatal::~Fatal((Fatal *)local_238);
  }
  puVar1 = (pMVar13->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (puVar1 == (pMVar13->memories).
                super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    bVar25 = true;
  }
  else {
    bVar25 = (((puVar1->_M_t).
               super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
               super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl)->addressType).id == 2;
  }
  pMVar22 = &pMVar13->allocator;
  local_38.wasm = pMVar13;
  pMVar13 = (Module *)MixedArena::allocSpace(pMVar22,0x40,8);
  *(Id *)&(pMVar13->exports).
          super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = BlockId;
  ((Type *)&(pMVar13->exports).
            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)->id = 0;
  (pMVar13->exports).
  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pMVar13->functions).
  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pMVar13->functions).
  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pMVar13->functions).
  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pMVar13->globals).
  super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pMVar13->globals).
  super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)pMVar22;
  if (!bVar25) {
    handle_unreachable("unhandled pointerType",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/abi/stack.h"
                       ,0x40);
  }
  x = (int)func + 0xfU & 0xfffffff0;
  sVar3 = (pGVar12->super_Importable).super_Named.name.super_IString.str._M_len;
  pcVar4 = (pGVar12->super_Importable).super_Named.name.super_IString.str._M_str;
  pEVar14 = (Expression *)MixedArena::allocSpace(pMVar22,0x20,8);
  pEVar14->_id = GlobalGetId;
  *(size_t *)(pEVar14 + 1) = sVar3;
  pEVar14[1].type.id = (uintptr_t)pcVar4;
  (pEVar14->type).id = 2;
  pCVar15 = Builder::makeConst<int>(&local_38,x);
  pBVar16 = (Binary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
  (pBVar16->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (pBVar16->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  pBVar16->op = SubInt32;
  pBVar16->left = pEVar14;
  pBVar16->right = (Expression *)pCVar15;
  Binary::finalize(pBVar16);
  this_00 = &(pMVar13->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  sVar3 = (pGVar12->super_Importable).super_Named.name.super_IString.str._M_len;
  pcVar4 = (pGVar12->super_Importable).super_Named.name.super_IString.str._M_str;
  pLVar17 = (LocalSet *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x20,8);
  (pLVar17->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id = LocalSetId;
  (pLVar17->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type.id = 0;
  pLVar17->index = IVar23;
  pLVar17->value = (Expression *)pBVar16;
  LocalSet::makeTee(pLVar17,(Type)0x2);
  pGVar18 = (GlobalSet *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
  (pGVar18->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression._id = GlobalSetId;
  (pGVar18->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression.type.id = 0;
  (pGVar18->name).super_IString.str._M_len = sVar3;
  (pGVar18->name).super_IString.str._M_str = pcVar4;
  pGVar18->value = (Expression *)pLVar17;
  GlobalSet::finalize(pGVar18);
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)this_00,
             (Expression *)pGVar18);
  ast = this_03 + 0xc;
  FindAllPointers<wasm::Return>::FindAllPointers
            ((FindAllPointers<wasm::Return> *)local_238,(Expression **)ast);
  for (auVar24 = local_238;
      auVar24 !=
      (undefined1  [8])
      finder.list.super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
      _M_impl.super__Vector_impl_data._M_start; auVar24 = (undefined1  [8])((long)auVar24 + 8)) {
    ppEVar2 = *(Expression ***)auVar24;
    pEVar14 = *ppEVar2;
    if (pEVar14->_id != ReturnId) {
      __assert_fail("int(_id) == int(T::SpecificId)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                    ,0x31b,"T *wasm::Expression::cast() [T = wasm::Return]");
    }
    if ((*(long *)(pEVar14 + 1) == 0) || (*(long *)(*(long *)(pEVar14 + 1) + 8) == 1)) {
      sVar3 = (pGVar12->super_Importable).super_Named.name.super_IString.str._M_len;
      pcVar4 = (pGVar12->super_Importable).super_Named.name.super_IString.str._M_str;
      ppEVar21 = ppEVar2;
      pEVar19 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
      pEVar19->_id = LocalGetId;
      *(Index *)(pEVar19 + 1) = IVar23;
      (pEVar19->type).id = 2;
      pCVar15 = Builder::makeConst<int>(&local_38,x);
      pBVar16 = (Binary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
      (pBVar16->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
      (pBVar16->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
      pBVar16->op = AddInt32;
      pBVar16->left = pEVar19;
      pBVar16->right = (Expression *)pCVar15;
      Binary::finalize(pBVar16);
      pGVar18 = (GlobalSet *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
      (pGVar18->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression._id =
           GlobalSetId;
      (pGVar18->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression.type.id = 0;
      (pGVar18->name).super_IString.str._M_len = sVar3;
      (pGVar18->name).super_IString.str._M_str = pcVar4;
      pGVar18->value = (Expression *)pBVar16;
      GlobalSet::finalize(pGVar18);
      wasm = (Module *)0x0;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 0;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)ppEVar21;
      this_01 = Builder::makeSequence(&local_38,(Expression *)pGVar18,pEVar14,type);
    }
    else {
      pMVar22 = &(local_38.wasm)->allocator;
      this_01 = (Block *)MixedArena::allocSpace(pMVar22,0x40,8);
      (this_01->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = BlockId;
      (this_01->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
      (this_01->name).super_IString.str._M_len = 0;
      (this_01->name).super_IString.str._M_str = (char *)0x0;
      (this_01->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      data = (Expression **)0x0;
      (this_01->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      usedElements = 0;
      (this_01->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      allocatedElements = 0;
      (this_01->list).allocator = pMVar22;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = *(ulong *)(*(long *)(pEVar14 + 1) + 8);
      IVar11 = Builder::addVar(this_03,(Function *)0x0,(Name)(auVar9 << 0x40),(Type)wasm);
      pLVar17 = Builder::makeLocalSet(&local_38,IVar11,*(Expression **)(pEVar14 + 1));
      this_04 = &this_01->list;
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&this_04->
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                 (Expression *)pLVar17);
      sVar3 = (pGVar12->super_Importable).super_Named.name.super_IString.str._M_len;
      pcVar4 = (pGVar12->super_Importable).super_Named.name.super_IString.str._M_str;
      pEVar19 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
      pEVar19->_id = LocalGetId;
      *(Index *)(pEVar19 + 1) = IVar23;
      (pEVar19->type).id = 2;
      pCVar15 = Builder::makeConst<int>(&local_38,x);
      pBVar16 = (Binary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
      (pBVar16->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
      (pBVar16->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
      pBVar16->op = AddInt32;
      pBVar16->left = pEVar19;
      pBVar16->right = (Expression *)pCVar15;
      Binary::finalize(pBVar16);
      pGVar18 = (GlobalSet *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
      (pGVar18->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression._id =
           GlobalSetId;
      (pGVar18->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression.type.id = 0;
      (pGVar18->name).super_IString.str._M_len = sVar3;
      (pGVar18->name).super_IString.str._M_str = pcVar4;
      pGVar18->value = (Expression *)pBVar16;
      GlobalSet::finalize(pGVar18);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&this_04->
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                 (Expression *)pGVar18);
      uVar5 = *(undefined8 *)(*(long *)(pEVar14 + 1) + 8);
      puVar20 = (undefined1 *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
      *puVar20 = 8;
      *(Index *)(puVar20 + 0x10) = IVar11;
      *(undefined8 *)(puVar20 + 8) = uVar5;
      pEVar14 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
      pEVar14->_id = ReturnId;
      (pEVar14->type).id = 1;
      *(undefined1 **)(pEVar14 + 1) = puVar20;
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&this_04->
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,pEVar14
                );
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 0;
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)pEVar14;
      Block::finalize(this_01,type_,Unknown);
    }
    *ppEVar2 = (Expression *)this_01;
  }
  this_02 = ast->wasm;
  uVar6 = ((Type *)&(this_02->exports).
                    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish)->id;
  if (uVar6 == 0) {
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)this_00,
               (Expression *)this_02);
    puVar7 = (pointer)(pGVar12->super_Importable).super_Named.name.super_IString.str._M_len;
    puVar8 = (pointer)(pGVar12->super_Importable).super_Named.name.super_IString.str._M_str;
    pEVar14 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
    pEVar14->_id = LocalGetId;
    *(Index *)(pEVar14 + 1) = IVar23;
    (pEVar14->type).id = 2;
    pCVar15 = Builder::makeConst<int>(&local_38,x);
    pBVar16 = (Binary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
    (pBVar16->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (pBVar16->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    pBVar16->op = AddInt32;
    pBVar16->left = pEVar14;
    pBVar16->right = (Expression *)pCVar15;
    Binary::finalize(pBVar16);
    this_02 = (Module *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
    *(Id *)&(this_02->exports).
            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = GlobalSetId;
    ((Type *)&(this_02->exports).
              super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)->id = 0;
    (this_02->exports).
    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = puVar7;
    (this_02->functions).
    super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = puVar8;
    (this_02->functions).
    super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)pBVar16;
    GlobalSet::finalize((GlobalSet *)this_02);
  }
  else if (uVar6 != 1) {
    SVar26 = HeapType::getSignature((HeapType *)(this_03 + 7));
    auVar10._8_8_ = 0;
    auVar10._0_8_ = SVar26.results.id.id;
    IVar11 = Builder::addVar(this_03,(Function *)0x0,(Name)(auVar10 << 0x40),(Type)wasm);
    pLVar17 = Builder::makeLocalSet(&local_38,IVar11,(Expression *)ast->wasm);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)this_00,
               (Expression *)pLVar17);
    sVar3 = (pGVar12->super_Importable).super_Named.name.super_IString.str._M_len;
    pcVar4 = (pGVar12->super_Importable).super_Named.name.super_IString.str._M_str;
    pEVar14 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
    pEVar14->_id = LocalGetId;
    *(Index *)(pEVar14 + 1) = IVar23;
    (pEVar14->type).id = 2;
    pCVar15 = Builder::makeConst<int>(&local_38,x);
    pBVar16 = (Binary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
    (pBVar16->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (pBVar16->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    pBVar16->op = AddInt32;
    pBVar16->left = pEVar14;
    pBVar16->right = (Expression *)pCVar15;
    Binary::finalize(pBVar16);
    pGVar18 = (GlobalSet *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
    (pGVar18->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression._id = GlobalSetId
    ;
    (pGVar18->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression.type.id = 0;
    (pGVar18->name).super_IString.str._M_len = sVar3;
    (pGVar18->name).super_IString.str._M_str = pcVar4;
    pGVar18->value = (Expression *)pBVar16;
    GlobalSet::finalize(pGVar18);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)this_00,
               (Expression *)pGVar18);
    SVar26 = HeapType::getSignature((HeapType *)(this_03 + 7));
    this_02 = (Module *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
    *(Id *)&(this_02->exports).
            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = LocalGetId;
    *(Index *)&(this_02->exports).
               super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage = IVar11;
    ((Type *)&(this_02->exports).
              super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)->id = SVar26.results.id.id;
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)this_00,
               (Expression *)this_02);
    goto LAB_00b4672c;
  }
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)this_00,
             (Expression *)this_02);
LAB_00b4672c:
  type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)this_02;
  Block::finalize((Block *)pMVar13,type__00,Unknown);
  ast->wasm = pMVar13;
  if (local_238 != (undefined1  [8])0x0) {
    operator_delete((void *)local_238,
                    (long)finder.list.
                          super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)local_238);
  }
  return;
}

Assistant:

inline void
getStackSpace(Index local, Function* func, Index size, Module& wasm) {
  auto* stackPointer = getStackPointerGlobal(wasm);
  if (!stackPointer) {
    Fatal() << "getStackSpace: failed to find the stack pointer";
  }
  // align the size
  size = stackAlign(size);
  auto pointerType =
    !wasm.memories.empty() ? wasm.memories[0]->addressType : Type::i32;
  // TODO: find existing stack usage, and add on top of that - carefully
  Builder builder(wasm);
  auto* block = builder.makeBlock();
  // TODO: add stack max check
  Expression* added;
  if (pointerType == Type::i32) {
    // The stack goes downward in the LLVM wasm backend.
    added =
      builder.makeBinary(SubInt32,
                         builder.makeGlobalGet(stackPointer->name, pointerType),
                         builder.makeConst(int32_t(size)));
  } else {
    WASM_UNREACHABLE("unhandled pointerType");
  }
  block->list.push_back(builder.makeGlobalSet(
    stackPointer->name, builder.makeLocalTee(local, added, pointerType)));
  auto makeStackRestore = [&]() {
    return builder.makeGlobalSet(
      stackPointer->name,
      builder.makeBinary(AddInt32,
                         builder.makeLocalGet(local, pointerType),
                         builder.makeConst(int32_t(size))));
  };
  // add stack restores to the returns
  FindAllPointers<Return> finder(func->body);
  for (auto** ptr : finder.list) {
    auto* ret = (*ptr)->cast<Return>();
    if (ret->value && ret->value->type != Type::unreachable) {
      // handle the returned value
      auto* block = builder.makeBlock();
      auto temp = builder.addVar(func, ret->value->type);
      block->list.push_back(builder.makeLocalSet(temp, ret->value));
      block->list.push_back(makeStackRestore());
      block->list.push_back(
        builder.makeReturn(builder.makeLocalGet(temp, ret->value->type)));
      block->finalize();
      *ptr = block;
    } else {
      // restore, then return
      *ptr = builder.makeSequence(makeStackRestore(), ret);
    }
  }
  // add stack restores to the body
  if (func->body->type == Type::none) {
    block->list.push_back(func->body);
    block->list.push_back(makeStackRestore());
  } else if (func->body->type == Type::unreachable) {
    block->list.push_back(func->body);
    // no need to restore the old stack value, we're gone anyhow
  } else {
    // save the return value
    auto temp = builder.addVar(func, func->getResults());
    block->list.push_back(builder.makeLocalSet(temp, func->body));
    block->list.push_back(makeStackRestore());
    block->list.push_back(builder.makeLocalGet(temp, func->getResults()));
  }
  block->finalize();
  func->body = block;
}